

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwt.c
# Opt level: O0

OPJ_UINT32 opj_dwt_max_resolution(opj_tcd_resolution_t *r,OPJ_UINT32 i)

{
  opj_tcd_resolution_t *poVar1;
  uint uVar2;
  uint local_18;
  OPJ_UINT32 w;
  OPJ_UINT32 mr;
  OPJ_UINT32 i_local;
  opj_tcd_resolution_t *r_local;
  
  local_18 = 0;
  w = i;
  _mr = r;
  while (w = w - 1, w != 0) {
    poVar1 = _mr + 1;
    uVar2 = _mr[1].x1 - poVar1->x0;
    if (local_18 < uVar2) {
      local_18 = uVar2;
    }
    uVar2 = _mr[1].y1 - _mr[1].y0;
    _mr = poVar1;
    if (local_18 < uVar2) {
      local_18 = uVar2;
    }
  }
  return local_18;
}

Assistant:

static OPJ_UINT32 opj_dwt_max_resolution(opj_tcd_resolution_t* OPJ_RESTRICT r, OPJ_UINT32 i) {
	OPJ_UINT32 mr	= 0;
	OPJ_UINT32 w;
	while( --i ) {
		++r;
		if( mr < ( w = (OPJ_UINT32)(r->x1 - r->x0) ) )
			mr = w ;
		if( mr < ( w = (OPJ_UINT32)(r->y1 - r->y0) ) )
			mr = w ;
	}
	return mr ;
}